

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void autocorr(double *vec,int N,double *acorr,int M)

{
  double dVar1;
  long lVar2;
  int M_00;
  
  if (N < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    M_00 = N + -1;
  }
  else {
    M_00 = 0;
    if (0 < M) {
      M_00 = M;
    }
  }
  autocovar(vec,N,acorr,M_00);
  dVar1 = *acorr;
  *acorr = 1.0;
  for (lVar2 = 1; lVar2 < M_00; lVar2 = lVar2 + 1) {
    acorr[lVar2] = acorr[lVar2] / dVar1;
  }
  return;
}

Assistant:

void autocorr(double* vec,int N,double* acorr, int M) {
	double var;
	int i;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar(vec,N,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}